

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

InputScalar * __thiscall Omega_h::InputScalar::get<std::__cxx11::string>(InputScalar *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  InputScalar *in_RSI;
  Omega_h local_50 [8];
  string full_name;
  InputScalar *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  
  std::__cxx11::string::string((string *)this);
  bVar1 = as(in_RSI,(string *)this);
  if (bVar1) {
    return this;
  }
  get_full_name_abi_cxx11_(local_50,&in_RSI->super_Input);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  fail("InputScalar \"%s\" string \"%s\" is not interpretable as a %s",uVar2,uVar3,"unknown type");
}

Assistant:

T InputScalar::get() const {
  T out;
  if (!as(out)) {
    auto full_name = get_full_name(*this);
    Omega_h_fail(
        "InputScalar \"%s\" string \"%s\" is not interpretable as a %s",
        full_name.c_str(), str.c_str(),
        (std::is_same<T, int>::value
                ? "int"
                : (std::is_same<T, double>::value
                          ? "double"
                          : (std::is_same<T, long long>::value
                                    ? "long long"
                                    : "unknown type"))));
  }
  return out;
}